

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O0

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::mpmc_blocking_queue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,size_t max_items)

{
  size_t in_RDI;
  condition_variable *this_00;
  condition_variable *this_01;
  circular_q<spdlog::details::async_msg> *unaff_retaddr;
  size_t max_items_00;
  
  max_items_00 = in_RDI;
  std::mutex::mutex((mutex *)0x29abad);
  this_00 = (condition_variable *)(in_RDI + 0x28);
  std::condition_variable::condition_variable(this_00);
  this_01 = (condition_variable *)(in_RDI + 0x58);
  std::condition_variable::condition_variable(this_01);
  circular_q<spdlog::details::async_msg>::circular_q(unaff_retaddr,max_items_00);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)this_01,(__integral_type_conflict)this_00);
  return;
}

Assistant:

explicit mpmc_blocking_queue(size_t max_items)
        : q_(max_items) {}